

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<kj::String,kj::StringPtr&,kj::StringTree>
          (StringTree *__return_storage_ptr__,kj *this,String *params,StringPtr *params_1,
          StringTree *params_2)

{
  String *str;
  StringPtr *value;
  StringTree *pSVar1;
  ArrayPtr<const_char> local_70;
  StringTree local_60;
  NoInfer<kj::StringTree> *local_28;
  StringTree *params_local_2;
  StringPtr *params_local_1;
  String *params_local;
  
  local_28 = (NoInfer<kj::StringTree> *)params_1;
  params_local_2 = (StringTree *)params;
  params_local_1 = (StringPtr *)this;
  params_local = (String *)__return_storage_ptr__;
  str = fwd<kj::String>((NoInfer<kj::String> *)this);
  _::toStringTreeOrCharSequence(&local_60,str);
  value = fwd<kj::StringPtr&>((StringPtr *)params_local_2);
  local_70 = _::toStringTreeOrCharSequence<kj::StringPtr&>(value);
  pSVar1 = fwd<kj::StringTree>(local_28);
  pSVar1 = _::toStringTreeOrCharSequence(pSVar1);
  StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree>
            (__return_storage_ptr__,&local_60,(StringTree *)&local_70,(ArrayPtr<const_char> *)pSVar1
             ,params_2);
  StringTree::~StringTree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}